

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf_common.cpp
# Opt level: O0

double SqrSum(vector<double,_std::allocator<double>_> *arr)

{
  size_type sVar1;
  const_reference pvVar2;
  double dVar3;
  undefined4 local_1c;
  double dStack_18;
  int i;
  double s;
  vector<double,_std::allocator<double>_> *arr_local;
  
  dStack_18 = 0.0;
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(arr);
    if (sVar1 <= (ulong)(long)local_1c) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](arr,(long)local_1c);
    dVar3 = sqr<double>(*pvVar2);
    dStack_18 = dVar3 + dStack_18;
    local_1c = local_1c + 1;
  }
  return dStack_18;
}

Assistant:

double SqrSum(const vector<double> &arr) {
    double s = 0;
    for (int i = 0; i < arr.size(); i++)
            s+=sqr(arr[i]);
    return s;
}